

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeIterator.cpp
# Opt level: O0

Node * __thiscall NodeIterator::operator*(NodeIterator *this)

{
  bool bVar1;
  reference ppEVar2;
  reference ppJVar3;
  reference ppNVar4;
  long *in_RDI;
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *in_stack_ffffffffffffffc8;
  set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *this_00;
  _Self local_20;
  _Self local_18 [3];
  
  if (*in_RDI == 0) {
    if (in_RDI[1] != 0) {
      this_00 = (set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *)(in_RDI + 4);
      ExitNode::joinSuccessors((ExitNode *)in_RDI[1]);
      local_20._M_node =
           (_Base_ptr)
           std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::end(this_00);
      bVar1 = std::operator!=((_Self *)this_00,&local_20);
      if (bVar1) {
        ppJVar3 = std::_Rb_tree_const_iterator<JoinNode_*>::operator*
                            ((_Rb_tree_const_iterator<JoinNode_*> *)0x192232);
        return &(*ppJVar3)->super_Node;
      }
    }
  }
  else {
    ForkNode::forkSuccessors((ForkNode *)*in_RDI);
    local_18[0]._M_node =
         (_Base_ptr)
         std::set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=((_Self *)(in_RDI + 3),local_18);
    if (bVar1) {
      ppEVar2 = std::_Rb_tree_const_iterator<EntryNode_*>::operator*
                          ((_Rb_tree_const_iterator<EntryNode_*> *)0x1921d2);
      return &(*ppEVar2)->super_Node;
    }
  }
  ppNVar4 = std::_Rb_tree_const_iterator<Node_*>::operator*
                      ((_Rb_tree_const_iterator<Node_*> *)0x19224e);
  return *ppNVar4;
}

Assistant:

Node *NodeIterator::operator*() const {
    if (forkNode) {
        if (forkSuccessorsIterator != forkNode->forkSuccessors().end()) {
            return *forkSuccessorsIterator;
        }
    } else if (exitNode) {
        if (joinSuccessorsIterator != exitNode->joinSuccessors().end()) {
            return *joinSuccessorsIterator;
        }
    }
    return *successorsIterator;
}